

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_gtk.cxx
# Opt level: O3

void gtk_up_box(int x,int y,int w,int h,Fl_Color c)

{
  Fl_Color FVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  gtk_up_frame(x,y,w,h,c);
  FVar1 = fl_color_average(0xff,c,0.4);
  Fl::set_box_color(FVar1);
  uVar3 = x + 2;
  uVar2 = (x + w) - 3;
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
            (fl_graphics_driver,(ulong)uVar3,(ulong)(y + 2U),(ulong)uVar2);
  FVar1 = fl_color_average(0xff,c,0.2);
  Fl::set_box_color(FVar1);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
            (fl_graphics_driver,(ulong)uVar3,(ulong)(y + 3),(ulong)uVar2);
  FVar1 = fl_color_average(0xff,c,0.1);
  Fl::set_box_color(FVar1);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
            (fl_graphics_driver,(ulong)uVar3,(ulong)(y + 4),(ulong)uVar2);
  Fl::set_box_color(c);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
            (fl_graphics_driver,(ulong)uVar3,(ulong)(y + 5),(ulong)(w - 4),(ulong)(h - 7));
  FVar1 = fl_color_average(0x38,c,0.025);
  Fl::set_box_color(FVar1);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
            (fl_graphics_driver,(ulong)uVar3,(ulong)((h + y) - 4),(ulong)uVar2);
  FVar1 = fl_color_average(0x38,c,0.05);
  Fl::set_box_color(FVar1);
  uVar4 = (h + y) - 3;
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
            (fl_graphics_driver,(ulong)uVar3,(ulong)uVar4,(ulong)uVar2);
  FVar1 = fl_color_average(0x38,c,0.1);
  Fl::set_box_color(FVar1);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
            (fl_graphics_driver,(ulong)uVar3,(ulong)((h + y) - 2),(ulong)uVar2);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
            (fl_graphics_driver,(ulong)((w + x) - 2),(ulong)(y + 2U),(ulong)uVar4);
  return;
}

Assistant:

static void gtk_up_box(int x, int y, int w, int h, Fl_Color c) {
  gtk_up_frame(x, y, w, h, c);

  gtk_color(fl_color_average(FL_WHITE, c, 0.4f));
  fl_xyline(x + 2, y + 2, x + w - 3);
  gtk_color(fl_color_average(FL_WHITE, c, 0.2f));
  fl_xyline(x + 2, y + 3, x + w - 3);
  gtk_color(fl_color_average(FL_WHITE, c, 0.1f));
  fl_xyline(x + 2, y + 4, x + w - 3);
  gtk_color(c);
  fl_rectf(x + 2, y + 5, w - 4, h - 7);
  gtk_color(fl_color_average(FL_BLACK, c, 0.025f));
  fl_xyline(x + 2, y + h - 4, x + w - 3);
  gtk_color(fl_color_average(FL_BLACK, c, 0.05f));
  fl_xyline(x + 2, y + h - 3, x + w - 3);
  gtk_color(fl_color_average(FL_BLACK, c, 0.1f));
  fl_xyline(x + 2, y + h - 2, x + w - 3);
  fl_yxline(x + w - 2, y + 2, y + h - 3);
}